

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_add_stale_block(filemgr *file,bid_t pos,size_t len)

{
  list_elem *plVar1;
  long *plVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  list_elem *e;
  stale_data *item;
  
  if (*(long *)(in_RDI + 0x280) != 0) {
    plVar1 = list_end(*(list **)(in_RDI + 0x280));
    if ((plVar1 == (list_elem *)0x0) ||
       ((long)&(plVar1[-1].prev)->prev + (ulong)*(uint *)&plVar1[-1].next != in_RSI)) {
      plVar2 = (long *)calloc(1,0x28);
      *plVar2 = in_RSI;
      *(int *)(plVar2 + 1) = in_EDX;
      list_push_back(*(list **)(in_RDI + 0x280),(list_elem *)(plVar2 + 2));
    }
    else {
      *(int *)&plVar1[-1].next = *(int *)&plVar1[-1].next + in_EDX;
    }
  }
  return;
}

Assistant:

void filemgr_add_stale_block(struct filemgr *file,
                             bid_t pos,
                             size_t len)
{
    if (file->stale_list) {
        struct stale_data *item;
        struct list_elem *e;

        e = list_end(file->stale_list);

        if (e) {
            item = _get_entry(e, struct stale_data, le);
            if (item->pos + item->len == pos) {
                // merge if consecutive item
                item->len += len;
                return;
            }
        }

        item = (struct stale_data*)calloc(1, sizeof(struct stale_data));
        item->pos = pos;
        item->len = len;
        list_push_back(file->stale_list, &item->le);
    }
}